

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
          (AnimatedShapeSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromObject,Transform *identity,bool reverseOrientation,
          int materialIndex,string *materialName,int lightIndex,string *insideMedium,
          string *outsideMedium)

{
  ParameterDictionary local_98;
  
  ParameterDictionary::ParameterDictionary(&local_98,parameters);
  TransformedSceneEntity::TransformedSceneEntity
            (&this->super_TransformedSceneEntity,name,&local_98,loc,renderFromObject);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_98.params);
  this->identity = identity;
  this->reverseOrientation = reverseOrientation;
  this->materialIndex = materialIndex;
  std::__cxx11::string::string((string *)&this->materialName,(string *)materialName);
  this->lightIndex = lightIndex;
  std::__cxx11::string::string((string *)&this->insideMedium,(string *)insideMedium);
  std::__cxx11::string::string((string *)&this->outsideMedium,(string *)outsideMedium);
  return;
}

Assistant:

AnimatedShapeSceneEntity(const std::string &name, ParameterDictionary parameters,
                             FileLoc loc, const AnimatedTransform &renderFromObject,
                             const Transform *identity, bool reverseOrientation,
                             int materialIndex, const std::string &materialName,
                             int lightIndex, const std::string &insideMedium,
                             const std::string &outsideMedium)
        : TransformedSceneEntity(name, parameters, loc, renderFromObject),
          identity(identity),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}